

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O1

bool __thiscall S2::IsOrderLess(S2 *this,LoopOrder order1,LoopOrder order2,S2PointLoopSpan loop)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  bool bVar5;
  double *bp;
  reference pVVar6;
  reference pVVar7;
  long lVar8;
  double *ap_1;
  uint i;
  double *ap;
  bool bVar9;
  S2PointLoopSpan local_60;
  ulong local_50;
  ulong local_48;
  S2LogMessage local_40;
  
  local_60.super_S2PointSpan.len_ = (size_type)loop.super_S2PointSpan.ptr_;
  if ((LoopOrder)this == order1) {
    bVar9 = false;
  }
  else {
    local_60.super_S2PointSpan.ptr_ = (pointer)order2;
    pVVar6 = S2PointLoopSpan::operator[](&local_60,(int)this);
    pVVar7 = S2PointLoopSpan::operator[](&local_60,order1.first);
    if ((pVVar6->c_[0] == pVVar7->c_[0]) && (!NAN(pVVar6->c_[0]) && !NAN(pVVar7->c_[0]))) {
      lVar8 = 0;
      do {
        bVar9 = lVar8 == 0x10;
        if (bVar9) goto LAB_00203437;
        dVar2 = *(double *)((long)pVVar6->c_ + lVar8 + 8);
        pdVar1 = (double *)((long)pVVar7->c_ + lVar8 + 8);
        lVar8 = lVar8 + 8;
      } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
    }
    bVar9 = false;
LAB_00203437:
    if (!bVar9) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
                 ,0xfd,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: (loop[i1]) == (loop[i2]) ",0x27);
      abort();
    }
    bVar9 = 1 < (int)local_60.super_S2PointSpan.len_;
    if (1 < (int)local_60.super_S2PointSpan.len_) {
      local_48 = (ulong)this >> 0x20;
      local_50 = (ulong)order1 >> 0x20;
      iVar4 = (int)local_60.super_S2PointSpan.len_;
      do {
        i = (int)this + (int)local_48;
        this = (S2 *)(ulong)i;
        order1.first = order1.first + (int)local_50;
        order1.dir = 0;
        pVVar6 = S2PointLoopSpan::operator[](&local_60,i);
        pVVar7 = S2PointLoopSpan::operator[](&local_60,order1.first);
        lVar8 = 0;
        do {
          dVar2 = *(double *)((long)pVVar6->c_ + lVar8);
          dVar3 = *(double *)((long)pVVar7->c_ + lVar8);
          if (dVar2 != dVar3) {
            if (dVar2 < dVar3) {
              pVVar7 = (reference)0x1;
              goto LAB_0020351d;
            }
            break;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x18);
        pVVar6 = S2PointLoopSpan::operator[](&local_60,i);
        pVVar7 = S2PointLoopSpan::operator[](&local_60,order1.first);
        lVar8 = 0;
        do {
          dVar2 = *(double *)((long)pVVar7->c_ + lVar8);
          dVar3 = *(double *)((long)pVVar6->c_ + lVar8);
          if (dVar2 != dVar3) {
            if (dVar2 < dVar3) {
              pVVar7 = (reference)0x0;
              goto LAB_0020351d;
            }
            break;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x18);
        bVar9 = 2 < iVar4;
        bVar5 = 2 < iVar4;
        iVar4 = iVar4 + -1;
      } while (bVar5);
    }
LAB_0020351d:
    bVar9 = (bool)(bVar9 & (byte)pVVar7);
  }
  return bVar9;
}

Assistant:

static inline bool IsOrderLess(LoopOrder order1, LoopOrder order2,
                               S2PointLoopSpan loop) {
  if (order1 == order2) return false;

  int i1 = order1.first, i2 = order2.first;
  int dir1 = order1.dir, dir2 = order2.dir;
  S2_DCHECK_EQ(loop[i1], loop[i2]);
  for (int n = loop.size(); --n > 0; ) {
    i1 += dir1;
    i2 += dir2;
    if (loop[i1] < loop[i2]) return true;
    if (loop[i1] > loop[i2]) return false;
  }
  return false;
}